

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strip_accents.cpp
# Opt level: O3

string_t __thiscall
duckdb::StripAccentsOperator::Operation<duckdb::string_t,duckdb::string_t>
          (StripAccentsOperator *this,string_t input,Vector *result)

{
  anon_union_16_2_67f50693_for_value aVar1;
  long lVar2;
  utf8proc_uint8_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong len;
  uint uVar6;
  anon_union_16_2_67f50693_for_value aVar7;
  undefined8 local_30;
  utf8proc_uint8_t *local_28;
  
  local_28 = input.value._0_8_;
  aVar1.pointer.ptr = (char *)local_28;
  aVar1._0_8_ = this;
  aVar7.pointer.ptr = (char *)local_28;
  aVar7._0_8_ = this;
  local_30 = this;
  uVar6 = (uint)this;
  puVar3 = (utf8proc_uint8_t *)((long)&local_30 + 4);
  if (0xc < uVar6) {
    puVar3 = local_28;
  }
  len = (ulong)this & 0xffffffff;
  uVar4 = (ulong)(uVar6 & 0xfffffff8);
  uVar5 = 8;
  while (uVar5 <= len) {
    lVar2 = uVar5 - 8;
    uVar5 = uVar5 + 8;
    if ((*(ulong *)(puVar3 + lVar2) & 0x8080808080808080) != 0) goto LAB_009fad2c;
  }
  if (uVar6 <= (uVar6 & 0xfffffff8)) {
    return (string_t)aVar7;
  }
  while (-1 < (char)puVar3[uVar4]) {
    uVar4 = uVar4 + 1;
    if (len == uVar4) {
      return (string_t)aVar1;
    }
  }
LAB_009fad2c:
  puVar3 = utf8proc_remove_accents(puVar3,len);
  aVar7.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::AddString(input.value._8_8_,(char *)puVar3);
  free(puVar3);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar7.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		if (IsAscii(input.GetData(), input.GetSize())) {
			return input;
		}

		// non-ascii, perform collation
		auto stripped = utf8proc_remove_accents((const utf8proc_uint8_t *)input.GetData(),
		                                        UnsafeNumericCast<utf8proc_ssize_t>(input.GetSize()));
		auto result_str = StringVector::AddString(result, const_char_ptr_cast(stripped));
		free(stripped);
		return result_str;
	}